

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

char * flags_to_string(CHAR_DATA *ch,flag_type *showflags,int flagsperline)

{
  char *pcVar1;
  int in_EDX;
  long *in_RSI;
  char temp_value [4608];
  int col;
  int flag;
  char local_1228 [48];
  char *in_stack_ffffffffffffee08;
  int local_1c;
  
  local_1c = 0;
  local_1228[0] = '\0';
  while (*in_RSI != 0) {
    strcat(local_1228,(char *)*in_RSI);
    local_1c = local_1c + 1;
    if (local_1c % in_EDX == 0) {
      strcat(local_1228,"\n\r");
    }
    else {
      strcat(local_1228," ");
    }
  }
  if (local_1228[0] == '\0') {
    sprintf(local_1228,"Error looking up flag names.\n\r");
  }
  pcVar1 = palloc_string(in_stack_ffffffffffffee08);
  return pcVar1;
}

Assistant:

char *flags_to_string(CHAR_DATA *ch, const struct flag_type *showflags, int flagsperline)
{
	int flag, col = 0;
	char temp_value[MAX_INPUT_LENGTH];
	temp_value[0] = '\0';

	for (flag = 0; showflags[flag].name != nullptr; flag = flag++)
	{
		strcat(temp_value, showflags[flag].name);

		if (++col % flagsperline == 0)
			strcat(temp_value, "\n\r");
		else
			strcat(temp_value, " ");
	}

	if (temp_value[0] == '\0')
		sprintf(temp_value, "Error looking up flag names.\n\r");

	return palloc_string(temp_value);
}